

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> __thiscall
cmGraphVizWriter::CreateTargetFile(cmGraphVizWriter *this,cmLinkItem *item,string *fileNameSuffix)

{
  cmGeneratedFileStream *fs;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string perTargetFileName;
  string pathSafeItemName;
  string sStack_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  PathSafeString(&local_a8,psVar1);
  local_58.View_._M_str = *(char **)&item[1].Cross;
  local_58.View_._M_len =
       (size_t)item[1].Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  local_88.View_._M_str = local_88.Digits_;
  local_88.View_._M_len = 1;
  local_88.Digits_[0] = '.';
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (&sStack_c8,&local_58,&local_88,&local_a8,in_RCX);
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  fs = (cmGeneratedFileStream *)(this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor;
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  WriteHeader((cmGraphVizWriter *)item,fs,psVar1);
  WriteNode((cmGraphVizWriter *)item,
            (cmGeneratedFileStream *)
            (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor,
            (cmLinkItem *)fileNameSuffix);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  return (__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
          )(__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmGeneratedFileStream> cmGraphVizWriter::CreateTargetFile(
  cmLinkItem const& item, std::string const& fileNameSuffix)
{
  auto const pathSafeItemName = PathSafeString(item.AsStr());
  auto const perTargetFileName =
    cmStrCat(this->FileName, '.', pathSafeItemName, fileNameSuffix);
  auto perTargetFileStream =
    cm::make_unique<cmGeneratedFileStream>(perTargetFileName);

  this->WriteHeader(*perTargetFileStream, item.AsStr());
  this->WriteNode(*perTargetFileStream, item);

  return perTargetFileStream;
}